

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

void __thiscall fasttext::Args::Args(Args *this)

{
  (this->manualArgs_)._M_h._M_buckets = &(this->manualArgs_)._M_h._M_single_bucket;
  (this->manualArgs_)._M_h._M_bucket_count = 1;
  (this->manualArgs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->manualArgs_)._M_h._M_element_count = 0;
  (this->manualArgs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->manualArgs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->manualArgs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  (this->input)._M_string_length = 0;
  (this->input).field_2._M_local_buf[0] = '\0';
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->pretrainedVectors)._M_dataplus._M_p = (pointer)&(this->pretrainedVectors).field_2;
  (this->pretrainedVectors)._M_string_length = 0;
  (this->pretrainedVectors).field_2._M_local_buf[0] = '\0';
  (this->autotuneValidationFile)._M_dataplus._M_p = (pointer)&(this->autotuneValidationFile).field_2
  ;
  (this->autotuneValidationFile)._M_string_length = 0;
  (this->autotuneValidationFile).field_2._M_local_buf[0] = '\0';
  (this->autotuneMetric)._M_dataplus._M_p = (pointer)&(this->autotuneMetric).field_2;
  (this->autotuneMetric)._M_string_length = 0;
  (this->autotuneMetric).field_2._M_local_buf[0] = '\0';
  (this->autotuneModelSize)._M_dataplus._M_p = (pointer)&(this->autotuneModelSize).field_2;
  (this->autotuneModelSize)._M_string_length = 0;
  (this->autotuneModelSize).field_2._M_local_buf[0] = '\0';
  this->lr = 0.05;
  this->loss = ns;
  this->model = sg;
  this->bucket = 2000000;
  this->minn = 3;
  this->maxn = 6;
  this->thread = 0xc;
  this->lrUpdateRate = 100;
  this->dim = 100;
  this->ws = 5;
  this->epoch = 5;
  this->minCount = 5;
  this->minCountLabel = 0;
  this->neg = 5;
  this->wordNgrams = 1;
  this->t = 0.0001;
  std::__cxx11::string::_M_replace((ulong)&this->label,0,(char *)0x0,0x13e260);
  this->verbose = 2;
  std::__cxx11::string::_M_replace
            ((ulong)&this->pretrainedVectors,0,(char *)(this->pretrainedVectors)._M_string_length,
             0x140945);
  this->saveOutput = false;
  this->cutoff = 0;
  this->seed = 0;
  *(undefined4 *)((long)&this->seed + 3) = 0;
  this->dsub = 2;
  std::__cxx11::string::_M_replace
            ((ulong)&this->autotuneValidationFile,0,
             (char *)(this->autotuneValidationFile)._M_string_length,0x140945);
  std::__cxx11::string::_M_replace
            ((ulong)&this->autotuneMetric,0,(char *)(this->autotuneMetric)._M_string_length,0x13e26a
            );
  this->autotunePredictions = 1;
  this->autotuneDuration = 300;
  std::__cxx11::string::_M_replace
            ((ulong)&this->autotuneModelSize,0,(char *)(this->autotuneModelSize)._M_string_length,
             0x140945);
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  minCountLabel = 0;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  minn = 3;
  maxn = 6;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  pretrainedVectors = "";
  saveOutput = false;
  seed = 0;

  qout = false;
  retrain = false;
  qnorm = false;
  cutoff = 0;
  dsub = 2;

  autotuneValidationFile = "";
  autotuneMetric = "f1";
  autotunePredictions = 1;
  autotuneDuration = 60 * 5; // 5 minutes
  autotuneModelSize = "";
}